

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.h
# Opt level: O3

void __thiscall
xemmai::t_parser::t_error::t_error
          (t_error *this,wstring_view a_message,wstring_view a_path,t_at *a_at)

{
  size_t sVar1;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *__str;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_70;
  long *local_50;
  long local_48;
  long local_40 [2];
  
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>
            ((wstring *)&local_70,a_message._M_str,a_message._M_str + a_message._M_len);
  __str = std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>::
          replace(&local_70,0,0,L"syntax error: ",0xe);
  std::__cxx11::wstring::wstring((wstring *)&local_50,__str);
  (this->super_t_throwable)._vptr_t_throwable = (_func_int **)&PTR__t_throwable_0019b4f8;
  (this->super_t_throwable).v_backtrace._M_b._M_p = (__pointer_type)0x0;
  (this->super_t_throwable).v_message._M_dataplus._M_p =
       (pointer)&(this->super_t_throwable).v_message.field_2;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>
            ((wstring *)&(this->super_t_throwable).v_message,local_50,(long)local_50 + local_48 * 4)
  ;
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity * 4 + 4);
  }
  (this->super_t_throwable)._vptr_t_throwable = (_func_int **)&PTR__t_error_0019b9f0;
  (this->v_path)._M_dataplus._M_p = (pointer)&(this->v_path).field_2;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>
            ((wstring *)&this->v_path,a_path._M_str,a_path._M_str + a_path._M_len);
  (this->v_at).v_column = a_at->v_column;
  sVar1 = a_at->v_line;
  (this->v_at).v_position = a_at->v_position;
  (this->v_at).v_line = sVar1;
  return;
}

Assistant:

t_error(std::wstring_view a_message, std::wstring_view a_path, const t_at& a_at) : t_throwable(L"syntax error: " + std::wstring(a_message)), v_path(a_path), v_at(a_at)
		{
		}